

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O2

int HRSS_generate_key(HRSS_public_key *out_pub,HRSS_private_key *out_priv,uint8_t *in)

{
  POLY_MUL_SCRATCH *out;
  poly *out_00;
  ulong uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint i;
  poly *ppVar5;
  private_key *out_01;
  POLY_MUL_SCRATCH *scratch;
  long lVar6;
  crypto_word_t *pcVar7;
  int iVar8;
  size_t i_1;
  long lVar9;
  ulong uVar10;
  crypto_word_t cVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  crypto_word_t m;
  poly *x;
  bool bVar15;
  crypto_word_t *local_c80;
  void *malloc_ptr;
  poly2 local_c48;
  poly2 local_be8;
  undefined1 local_b90 [24];
  undefined1 local_b78 [16];
  undefined1 local_b68 [16];
  undefined1 local_b58 [16];
  undefined1 local_b48 [16];
  poly2 v;
  poly a;
  
  ppVar5 = &public_key_from_external(out_pub)->ph;
  out_01 = private_key_from_external(out_priv);
  scratch = (POLY_MUL_SCRATCH *)malloc_align32(&malloc_ptr,0x9ce0);
  if (scratch == (POLY_MUL_SCRATCH *)0x0) {
    iVar8 = 0;
    memset(out_pub,0,0x590);
    RAND_bytes(out_priv->opaque,0x710);
  }
  else {
    memset(scratch,0xff,0x9ce0);
    uVar2 = *(undefined8 *)(in + 0x580);
    uVar3 = *(undefined8 *)(in + 0x588);
    uVar4 = *(undefined8 *)(in + 0x590);
    *(undefined8 *)out_01->hmac_key = *(undefined8 *)(in + 0x578);
    *(undefined8 *)(out_01->hmac_key + 8) = uVar2;
    *(undefined8 *)(out_01->hmac_key + 0x10) = uVar3;
    *(undefined8 *)(out_01->hmac_key + 0x18) = uVar4;
    out = scratch + 1;
    poly_short_sample_plus((poly *)out,in);
    poly3_from_poly(&out_01->f,(poly *)out);
    HRSS_poly3_invert(&out_01->f_inverse,&out_01->f);
    out_00 = (poly *)((long)&scratch[1].u + 0x580);
    poly_short_sample_plus(out_00,in + 700);
    for (lVar6 = 0x4630; lVar6 != 0x48ed; lVar6 = lVar6 + 1) {
      *(short *)((long)&scratch->u + lVar6 * 2) = *(short *)((long)&scratch->u + lVar6 * 2) * 3;
    }
    poly_mul_x_minus_1(out_00);
    poly_mul(scratch,(poly *)((long)&scratch[1].u + 0xb00),(poly *)out,out_00);
    for (lVar6 = 0; lVar6 != 0x2bd; lVar6 = lVar6 + 1) {
      a.field_0.v[lVar6] = -*(short *)((long)&scratch[1].u + lVar6 * 2 + 0xb00);
    }
    a.field_0.v[0x2bf] = 0;
    a.field_0.vectors[0x57][1]._2_4_ = 0;
    v.v[0] = 0;
    v.v[1] = 0;
    v.v[2] = 0;
    v.v[3] = 0;
    v.v[4] = 0;
    v.v[5] = 0;
    v.v[10] = 0;
    v.v[6] = 0;
    v.v[7] = 0;
    v.v[8] = 0;
    v.v[9] = 0;
    local_b90._8_16_ = (undefined1  [16])0x0;
    local_b78 = (undefined1  [16])0x0;
    local_b68 = (undefined1  [16])0x0;
    local_b58 = (undefined1  [16])0x0;
    local_b48 = (undefined1  [16])0x0;
    local_b90._0_8_ = 1;
    local_c48.v[0]._0_4_ = 0xffffffff;
    local_c48.v[0]._4_4_ = 0xffffffff;
    local_c48.v[1]._0_4_ = 0xffffffff;
    local_c48.v[1]._4_4_ = 0xffffffff;
    local_c48.v[2]._0_4_ = 0xffffffff;
    local_c48.v[2]._4_4_ = 0xffffffff;
    local_c48.v[3]._0_4_ = 0xffffffff;
    local_c48.v[3]._4_4_ = 0xffffffff;
    local_c48.v[4]._0_4_ = 0xffffffff;
    local_c48.v[4]._4_4_ = 0xffffffff;
    local_c48.v[5]._0_4_ = 0xffffffff;
    local_c48.v[5]._4_4_ = 0xffffffff;
    local_c48.v[6]._0_4_ = 0xffffffff;
    local_c48.v[6]._4_4_ = 0xffffffff;
    local_c48.v[7]._0_4_ = 0xffffffff;
    local_c48.v[7]._4_4_ = 0xffffffff;
    local_c48.v[8]._0_4_ = 0xffffffff;
    local_c48.v[8]._4_4_ = 0xffffffff;
    local_c48.v[9]._0_4_ = 0xffffffff;
    local_c48.v[9]._4_4_ = 0xffffffff;
    local_c48.v[10] = 0x1fffffffffffffff;
    iVar8 = 0;
    pcVar7 = local_be8.v;
    uVar13 = 0;
    for (lVar6 = 0x48f0; lVar6 != 0x4bad; lVar6 = lVar6 + 1) {
      uVar13 = (ulong)*(ushort *)((long)&scratch->u + lVar6 * 2) << 0x3f | uVar13 >> 1;
      iVar8 = iVar8 + 1;
      if (iVar8 == 0x40) {
        *pcVar7 = uVar13;
        pcVar7 = pcVar7 + 1;
        iVar8 = 0;
        uVar13 = 0;
      }
    }
    *pcVar7 = uVar13 >> (-(char)iVar8 & 0x3fU);
    lVar6 = CONCAT17(local_be8.v[10]._7_1_,(undefined7)local_be8.v[10]);
    for (lVar9 = 0; lVar9 != 0xb; lVar9 = lVar9 + 1) {
      local_be8.v[lVar9] = local_be8.v[lVar9] ^ (lVar6 << 3) >> 0x3f;
    }
    local_be8.v[10]._7_1_ = local_be8.v[10]._7_1_ & 0xf;
    poly2_reverse_700(&local_be8,&local_be8);
    uVar12 = 1;
    local_c80 = v.v;
    for (lVar6 = 0; lVar6 != 0x577; lVar6 = lVar6 + 1) {
      uVar13 = 0;
      for (lVar9 = 0; lVar9 != 0xb; lVar9 = lVar9 + 1) {
        cVar11 = uVar13 + v.v[lVar9] * 2;
        uVar13 = v.v[lVar9] >> 0x3f;
        v.v[lVar9] = cVar11;
      }
      uVar14 = (uint)local_be8.v[0] & 1;
      cVar11 = -(ulong)uVar14;
      if ((int)uVar12 < 0) {
        cVar11 = 0;
      }
      if (uVar12 == 0) {
        cVar11 = 0;
      }
      m = -(ulong)(uVar14 & (uint)local_c48.v[0]);
      poly2_cswap(&local_c48,&local_be8,cVar11);
      poly2_fmadd(&local_be8,&local_c48,m);
      uVar10 = 0;
      for (uVar13 = 10; uVar13 < 0xb; uVar13 = uVar13 - 1) {
        uVar1 = local_be8.v[uVar13];
        local_be8.v[uVar13] = uVar10 << 0x3f | uVar1 >> 1;
        uVar10 = uVar1;
      }
      uVar12 = (~(uint)cVar11 & uVar12 | -uVar12 & (uint)cVar11) + 1;
      poly2_cswap(&v,(poly2 *)local_b90,cVar11);
      poly2_fmadd((poly2 *)local_b90,&v,m);
    }
    if (uVar12 != 0) {
      __assert_fail("delta == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss.cc"
                    ,0x5f3,"void poly_invert_mod2(struct poly *, const struct poly *)");
    }
    if (((uint)local_c48.v[0] & 1) == 0) {
      __assert_fail("f.v[0] & 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hrss/hrss.cc"
                    ,0x5f4,"void poly_invert_mod2(struct poly *, const struct poly *)");
    }
    x = (poly *)((long)&scratch[1].u + 0x1080);
    poly2_reverse_700(&v,&v);
    iVar8 = 0;
    uVar13 = v.v[0];
    for (lVar6 = 0x4bb0; lVar6 != 0x4e6d; lVar6 = lVar6 + 1) {
      *(ushort *)((long)&scratch->u + lVar6 * 2) = (ushort)uVar13 & 1;
      iVar8 = iVar8 + 1;
      if (iVar8 == 0x40) {
        uVar13 = local_c80[1];
        local_c80 = local_c80 + 1;
        iVar8 = 0;
      }
      else {
        uVar13 = uVar13 >> 1;
      }
    }
    *(undefined2 *)((long)&scratch[1].u + 0x15fe) = 0;
    *(undefined4 *)((long)&scratch[1].u + 0x15fa) = 0;
    poly_assert_normalized(x);
    iVar8 = 4;
    while (bVar15 = iVar8 != 0, iVar8 = iVar8 + -1, bVar15) {
      poly_mul(scratch,(poly *)&v,&a,x);
      v.v[0]._0_2_ = (short)v.v[0] + 2;
      poly_mul(scratch,x,x,(poly *)&v);
    }
    poly_assert_normalized(x);
    poly_mul(scratch,ppVar5,x,out_00);
    poly_mul(scratch,ppVar5,ppVar5,out_00);
    poly_clamp(ppVar5);
    ppVar5 = &out_01->ph_inverse;
    poly_mul(scratch,ppVar5,x,(poly *)out);
    poly_mul(scratch,ppVar5,ppVar5,(poly *)out);
    poly_clamp(ppVar5);
    OPENSSL_free(malloc_ptr);
    iVar8 = 1;
  }
  return iVar8;
}

Assistant:

int HRSS_generate_key(
    struct HRSS_public_key *out_pub, struct HRSS_private_key *out_priv,
    const uint8_t in[HRSS_SAMPLE_BYTES + HRSS_SAMPLE_BYTES + 32]) {
  struct public_key *pub = public_key_from_external(out_pub);
  struct private_key *priv = private_key_from_external(out_priv);

  struct vars {
    struct POLY_MUL_SCRATCH scratch;
    struct poly f;
    struct poly pg_phi1;
    struct poly pfg_phi1;
    struct poly pfg_phi1_inverse;
  };

  void *malloc_ptr;
  struct vars *const vars = reinterpret_cast<struct vars *>(
      malloc_align32(&malloc_ptr, sizeof(struct vars)));
  if (!vars) {
    // If the caller ignores the return value the output will still be safe.
    // The private key output is randomised in case it's later passed to
    // |HRSS_encap|.
    memset(out_pub, 0, sizeof(struct HRSS_public_key));
    RAND_bytes((uint8_t *)out_priv, sizeof(struct HRSS_private_key));
    return 0;
  }

#if !defined(NDEBUG)
  OPENSSL_memset(vars, 0xff, sizeof(struct vars));
#endif

  OPENSSL_memcpy(priv->hmac_key, in + 2 * HRSS_SAMPLE_BYTES,
                 sizeof(priv->hmac_key));

  poly_short_sample_plus(&vars->f, in);
  poly3_from_poly(&priv->f, &vars->f);
  HRSS_poly3_invert(&priv->f_inverse, &priv->f);

  // pg_phi1 is p (i.e. 3) × g × Φ(1) (i.e. 𝑥-1).
  poly_short_sample_plus(&vars->pg_phi1, in + HRSS_SAMPLE_BYTES);
  for (unsigned i = 0; i < N; i++) {
    vars->pg_phi1.v[i] *= 3;
  }
  poly_mul_x_minus_1(&vars->pg_phi1);

  poly_mul(&vars->scratch, &vars->pfg_phi1, &vars->f, &vars->pg_phi1);

  poly_invert(&vars->scratch, &vars->pfg_phi1_inverse, &vars->pfg_phi1);

  poly_mul(&vars->scratch, &pub->ph, &vars->pfg_phi1_inverse, &vars->pg_phi1);
  poly_mul(&vars->scratch, &pub->ph, &pub->ph, &vars->pg_phi1);
  poly_clamp(&pub->ph);

  poly_mul(&vars->scratch, &priv->ph_inverse, &vars->pfg_phi1_inverse,
           &vars->f);
  poly_mul(&vars->scratch, &priv->ph_inverse, &priv->ph_inverse, &vars->f);
  poly_clamp(&priv->ph_inverse);

  OPENSSL_free(malloc_ptr);
  return 1;
}